

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * sym_AddVar(char *symName,int32_t value)

{
  bool bVar1;
  char *pcVar2;
  Symbol *local_28;
  Symbol *sym;
  int32_t value_local;
  char *symName_local;
  
  local_28 = sym_FindExactSymbol(symName);
  if (local_28 == (Symbol *)0x0) {
    local_28 = createsymbol(symName);
  }
  else {
    bVar1 = sym_IsDefined(local_28);
    if ((bVar1) && (local_28->type != SYM_VAR)) {
      pcVar2 = "constant";
      if (local_28->type == SYM_LABEL) {
        pcVar2 = "label";
      }
      error("\'%s\' already defined as %s at ",symName,pcVar2);
      dumpFilename(local_28);
      putc(10,_stderr);
      return local_28;
    }
    updateSymbolFilename(local_28);
  }
  local_28->type = SYM_VAR;
  (local_28->field_8).value = value;
  return local_28;
}

Assistant:

struct Symbol *sym_AddVar(char const *symName, int32_t value)
{
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym) {
		sym = createsymbol(symName);
	} else if (sym_IsDefined(sym) && sym->type != SYM_VAR) {
		error("'%s' already defined as %s at ",
		      symName, sym->type == SYM_LABEL ? "label" : "constant");
		dumpFilename(sym);
		putc('\n', stderr);
		return sym;
	} else {
		updateSymbolFilename(sym);
	}

	sym->type = SYM_VAR;
	sym->value = value;

	return sym;
}